

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

void apply_closure(fsg_model_t *fsg,bitvec_t *active)

{
  int iVar1;
  hash_table_t *h;
  void *pvVar2;
  hash_iter_t *itor;
  int iVar3;
  ulong uVar4;
  
  if (0 < fsg->n_state) {
    uVar4 = 0;
    do {
      if (((active[uVar4 >> 5 & 0x7ffffff] >> ((uint)uVar4 & 0x1f) & 1) != 0) &&
         (h = fsg->trans[uVar4].null_trans, h != (hash_table_t *)0x0)) {
        for (itor = hash_table_iter(h); itor != (hash_iter_t *)0x0;
            itor = hash_table_iter_next(itor)) {
          pvVar2 = itor->ent->val;
          iVar1 = *(int *)((long)pvVar2 + 4);
          iVar3 = iVar1 + 0x1f;
          if (-1 < iVar1) {
            iVar3 = iVar1;
          }
          active[iVar3 >> 5] = active[iVar3 >> 5] | 1 << ((byte)iVar1 & 0x1f);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                  ,0x3b4,"epsilon %d -> %d\n",uVar4 & 0xffffffff,(ulong)*(uint *)((long)pvVar2 + 4))
          ;
        }
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)fsg->n_state);
  }
  return;
}

Assistant:

static void
apply_closure(fsg_model_t *fsg, bitvec_t *active)
{
    int state;

    /* This is a bit slow, sorry. */
    for (state = 0; state < fsg_model_n_state(fsg); ++state) {
        hash_table_t *null_trans;
        hash_iter_t *itor;

        if (!bitvec_is_set(active, state))
            continue;
        null_trans = fsg->trans[state].null_trans;
        if (null_trans == NULL)
            continue;
        /* We assume closure has already been done, so no need to
         * continue following epsilons. */
        for (itor = hash_table_iter(null_trans);
             itor != NULL; itor = hash_table_iter_next(itor)) {
            fsg_link_t *link = (fsg_link_t *)hash_entry_val(itor->ent);
            bitvec_set(active, link->to_state);
            E_INFO("epsilon %d -> %d\n", state, link->to_state);
        }
    }
}